

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_2d1e6d::LaneBasedExecutionQueue::cancelAllJobs(LaneBasedExecutionQueue *this)

{
  mutex *__mutex;
  mutex *__mutex_00;
  pointer __p_00;
  pointer *__ptr;
  pointer __p;
  __uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> local_28;
  
  __mutex = &this->readyJobsMutex;
  std::mutex::lock(__mutex);
  __mutex_00 = &(this->spawnedProcesses).mutex;
  std::mutex::lock(__mutex_00);
  if (this->cancelled != false) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  this->cancelled = true;
  (this->spawnedProcesses).closed = true;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  llbuild::basic::ProcessGroup::signalAll(&this->spawnedProcesses,2);
  std::mutex::lock(&this->killAfterTimeoutThreadMutex);
  __p_00 = (pointer)operator_new(8);
  (__p_00->_M_id)._M_thread = 0;
  local_28._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl =
       (tuple<std::thread_*,_std::default_delete<std::thread>_>)operator_new(0x20);
  *(undefined ***)
   local_28._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
   super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = &PTR___State_00203b70;
  *(LaneBasedExecutionQueue **)
   ((long)local_28._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 8) = this;
  *(code **)((long)local_28._M_t.
                   super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
                   super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 0x10) =
       killAfterTimeout;
  *(long *)((long)local_28._M_t.
                  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
                  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 0x18) = 0;
  std::thread::_M_start_thread(__p_00,&local_28,0);
  if ((_Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>)
      local_28._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl != (thread *)0x0) {
    (**(code **)(*(long *)local_28._M_t.
                          super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
                          super__Head_base<0UL,_std::thread_*,_false>._M_head_impl + 8))();
  }
  local_28._M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl =
       (tuple<std::thread_*,_std::default_delete<std::thread>_>)
       (_Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>)0x0;
  std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
            ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)
             &this->killAfterTimeoutThread,__p_00);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)&local_28);
  pthread_mutex_unlock((pthread_mutex_t *)&this->killAfterTimeoutThreadMutex);
  return;
}

Assistant:

virtual void cancelAllJobs() override {
    {
      std::lock_guard<std::mutex> lock(readyJobsMutex);
      std::lock_guard<std::mutex> guard(spawnedProcesses.mutex);
      if (cancelled) return;
      cancelled = true;
      spawnedProcesses.close();
      readyJobsCondition.notify_all();
    }

    spawnedProcesses.signalAll(SIGINT);
    {
      std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
      killAfterTimeoutThread = llvm::make_unique<std::thread>(
          &LaneBasedExecutionQueue::killAfterTimeout, this);
    }
  }